

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void __thiscall
cmDependsFortran::MatchRemoteModules(cmDependsFortran *this,istream *fin,char *stampDir)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  undefined1 local_40 [7];
  bool doing_provides;
  string line;
  char *stampDir_local;
  istream *fin_local;
  cmDependsFortran *this_local;
  
  line.field_2._8_8_ = stampDir;
  std::__cxx11::string::string((string *)local_40);
  bVar2 = false;
  while (bVar1 = cmsys::SystemTools::GetLineFromStream(fin,(string *)local_40,(bool *)0x0,-1), bVar1
        ) {
    uVar3 = std::__cxx11::string::empty();
    if ((((uVar3 & 1) == 0) &&
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar4 != '#')) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar4 != '\r')) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      if (*pcVar4 == ' ') {
        if (bVar2 != false) {
          lVar5 = std::__cxx11::string::c_str();
          ConsiderModule(this,(char *)(lVar5 + 1),(char *)line.field_2._8_8_);
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"provides");
      }
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmDependsFortran::MatchRemoteModules(std::istream& fin,
                                          const char* stampDir)
{
  std::string line;
  bool doing_provides = false;
  while(cmSystemTools::GetLineFromStream(fin, line))
    {
    // Ignore comments and empty lines.
    if(line.empty() || line[0] == '#' || line[0] == '\r')
      {
      continue;
      }

    if(line[0] == ' ')
      {
      if(doing_provides)
        {
        this->ConsiderModule(line.c_str()+1, stampDir);
        }
      }
    else if(line == "provides")
      {
      doing_provides = true;
      }
    else
      {
      doing_provides = false;
      }
    }
}